

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindowPrivate::setMaximizeMode(QMdiSubWindowPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QMdiSubWindow *mdiChild;
  Data *pDVar5;
  QWidgetData *pQVar6;
  uint uVar7;
  uint uVar8;
  Representation RVar9;
  Representation RVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  QWidget *pQVar14;
  Data *pDVar15;
  QMenuBar *menuBar;
  QAbstractScrollArea *this_00;
  QWidget *pQVar16;
  QScrollBar *this_01;
  QScrollBar *this_02;
  ControlContainer *this_03;
  short sVar17;
  long in_FS_OFFSET;
  uint uVar18;
  QSize QVar19;
  uint uVar20;
  Representation RVar21;
  uint uVar22;
  uint uVar23;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  mdiChild = *(QMdiSubWindow **)&(this->super_QWidgetPrivate).field_0x8;
  ensureWindowState(this,WindowMaximized);
  this->isShadeMode = false;
  this->isMaximizeMode = true;
  pQVar14 = QApplication::focusWidget();
  if ((pQVar14 != (QWidget *)0x0) &&
     (((pDVar5 = (this->restoreFocusWidget).wp.d, pDVar5 == (Data *)0x0 ||
       (*(int *)(pDVar5 + 4) == 0)) || ((this->restoreFocusWidget).wp.value == (QObject *)0x0)))) {
    bVar11 = QWidget::isAncestorOf(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8,pQVar14);
    if (bVar11) {
      pDVar15 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar14->super_QObject);
      pDVar5 = (this->restoreFocusWidget).wp.d;
      (this->restoreFocusWidget).wp.d = pDVar15;
      (this->restoreFocusWidget).wp.value = &pQVar14->super_QObject;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar5 = *(int *)pDVar5 + -1;
        UNLOCK();
        if (*(int *)pDVar5 == 0) {
          operator_delete(pDVar5);
        }
      }
    }
  }
  setSizeGripVisible(this,false);
  if (((this->restoreSize).wd.m_i < 0) || ((this->restoreSize).ht.m_i < 0)) {
    pQVar6 = (mdiChild->super_QWidget).data;
    RVar21.m_i = (pQVar6->crect).y1.m_i;
    RVar9.m_i = (pQVar6->crect).x2.m_i;
    RVar10.m_i = (pQVar6->crect).y2.m_i;
    (this->oldGeometry).x1 = (Representation)(pQVar6->crect).x1.m_i;
    (this->oldGeometry).y1 = (Representation)RVar21.m_i;
    (this->oldGeometry).x2 = (Representation)RVar9.m_i;
    (this->oldGeometry).y2 = (Representation)RVar10.m_i;
    uVar1 = (this->oldGeometry).x2;
    uVar3 = (this->oldGeometry).y2;
    uVar2 = (this->oldGeometry).x1;
    uVar4 = (this->oldGeometry).y1;
    QVar19.wd.m_i = (uVar1 - uVar2) + 1;
    QVar19.ht.m_i = (uVar3 - uVar4) + 1;
    this->restoreSize = QVar19;
  }
  sVar17 = (short)((mdiChild->super_QWidget).data)->widget_attributes;
  if (sVar17 < 0) {
    (**(code **)(*(long *)&mdiChild->super_QWidget + 0x68))(mdiChild,0);
  }
  pDVar5 = (this->baseWidget).wp.d;
  if (((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
     (((this->baseWidget).wp.value != (QObject *)0x0 && (this->isWidgetHiddenByUs == true)))) {
    QWidget::show((QWidget *)(this->baseWidget).wp.value);
    this->isWidgetHiddenByUs = false;
  }
  updateGeometryConstraints(this);
  if (sVar17 < 0) {
    menuBar = QMdiSubWindowPrivate::menuBar(this);
    if (menuBar == (QMenuBar *)0x0) {
      pDVar5 = (this->controlContainer).wp.d;
      if (((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) ||
         ((this->controlContainer).wp.value == (QObject *)0x0)) {
        this_03 = (ControlContainer *)operator_new(0x70);
        QMdi::ControlContainer::ControlContainer(this_03,mdiChild);
        pDVar15 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_03);
        pDVar5 = (this->controlContainer).wp.d;
        (this->controlContainer).wp.d = pDVar15;
        (this->controlContainer).wp.value = (QObject *)this_03;
        if (pDVar5 != (Data *)0x0) {
          LOCK();
          *(int *)pDVar5 = *(int *)pDVar5 + -1;
          UNLOCK();
          if (*(int *)pDVar5 == 0) {
            operator_delete(pDVar5);
          }
        }
      }
    }
    else {
      showButtonsInMenuBar(this,menuBar);
    }
  }
  pQVar14 = *(QWidget **)(*(long *)&(mdiChild->super_QWidget).field_0x8 + 0x10);
  stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  _local_48 = QWidget::contentsRect(pQVar14);
  this_00 = (QAbstractScrollArea *)
            QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject);
  if (this_00 != (QAbstractScrollArea *)0x0) {
    pQVar16 = QAbstractScrollArea::viewport(this_00);
    if (pQVar16 == pQVar14) {
      this_01 = QAbstractScrollArea::horizontalScrollBar(this_00);
      this_02 = QAbstractScrollArea::verticalScrollBar(this_00);
      iVar12 = 0;
      if (this_01 != (QScrollBar *)0x0) {
        iVar12 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
      }
      iVar13 = 0;
      if (this_02 != (QScrollBar *)0x0) {
        iVar13 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
      }
      local_48._4_4_ = local_48._4_4_ - iVar13;
      local_48._0_4_ = local_48._0_4_ - iVar12;
      local_48._8_4_ = local_48._8_4_ - iVar12;
      RStack_3c.m_i = RStack_3c.m_i - iVar13;
      (this->oldGeometry).x1.m_i = (this->oldGeometry).x1.m_i + iVar12;
      (this->oldGeometry).y1.m_i = (this->oldGeometry).y1.m_i + iVar13;
      (this->oldGeometry).x2.m_i = (this->oldGeometry).x2.m_i + iVar12;
      (this->oldGeometry).y2.m_i = (this->oldGeometry).y2.m_i + iVar13;
    }
  }
  RVar21 = local_48._0_4_;
  uVar18 = (local_48._8_4_.m_i - RVar21.m_i) + 1;
  uVar20 = (local_48._12_4_.m_i - local_48._4_4_) + 1;
  uVar7 = (this->internalMinimumSize).wd.m_i;
  uVar8 = (this->internalMinimumSize).ht.m_i;
  uVar22 = -(uint)((int)uVar7 < (int)uVar18);
  uVar23 = -(uint)((int)uVar8 < (int)uVar20);
  RStack_3c.m_i = local_48._4_4_.m_i + -1 + (~uVar23 & uVar8 | uVar20 & uVar23);
  local_48._8_4_ = RVar21.m_i + -1 + (~uVar22 & uVar7 | uVar18 & uVar22);
  if (this->isInRubberBandMode == true) {
    QRubberBand::setGeometry(this->rubberBand,(QRect *)local_48);
  }
  else {
    QWidget::setGeometry(*(QWidget **)&(this->super_QWidgetPrivate).field_0x8,(QRect *)local_48);
  }
  ensureWindowState(this,WindowMaximized);
  if (sVar17 < 0) {
    (**(code **)(*(long *)&mdiChild->super_QWidget + 0x68))(mdiChild,1);
  }
  this->resizeEnabled = false;
  this->moveEnabled = false;
  setEnabled(this,MoveAction,false);
  setEnabled(this,MaximizeAction,false);
  setEnabled(this,MinimizeAction,true);
  setEnabled(this,RestoreAction,true);
  setEnabled(this,ResizeAction,this->resizeEnabled);
  restoreFocus(this);
  updateMask(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setMaximizeMode()
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(parent);

    ensureWindowState(Qt::WindowMaximized);
    isShadeMode = false;
    isMaximizeMode = true;

    storeFocusWidget();

#if QT_CONFIG(sizegrip)
    setSizeGripVisible(false);
#endif

    // Store old geometry and set restore size if not already set.
    if (!restoreSize.isValid()) {
        oldGeometry = q->geometry();
        restoreSize.setWidth(oldGeometry.width());
        restoreSize.setHeight(oldGeometry.height());
    }

    // Hide the window before we change the geometry to avoid multiple resize
    // events and wrong window state.
    const bool wasVisible = q->isVisible();
    if (wasVisible)
        q->setVisible(false);

    // Show the internal widget if it was hidden by us.
    if (baseWidget && isWidgetHiddenByUs) {
        baseWidget->show();
        isWidgetHiddenByUs = false;
    }

    updateGeometryConstraints();

    if (wasVisible) {
#if QT_CONFIG(menubar)
        if (QMenuBar *mBar = menuBar())
            showButtonsInMenuBar(mBar);
        else
#endif
        if (!controlContainer)
            controlContainer = new ControlContainer(q);
    }

    QWidget *parent = q->parentWidget();
    QRect availableRect = parent->contentsRect();

    // Adjust geometry if the sub-window is inside a scroll area.
    QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(parent->parentWidget());
    if (scrollArea && scrollArea->viewport() == parent) {
        QScrollBar *hbar = scrollArea->horizontalScrollBar();
        QScrollBar *vbar = scrollArea->verticalScrollBar();
        const int xOffset = hbar ? hbar->value() : 0;
        const int yOffset = vbar ? vbar->value() : 0;
        availableRect.adjust(-xOffset, -yOffset, -xOffset, -yOffset);
        oldGeometry.adjust(xOffset, yOffset, xOffset, yOffset);
    }

    setNewGeometry(&availableRect);
    // QWidget::setGeometry will reset Qt::WindowMaximized so we have to update it here.
    ensureWindowState(Qt::WindowMaximized);

    if (wasVisible)
        q->setVisible(true);

    resizeEnabled = false;
    moveEnabled = false;

#ifndef QT_NO_ACTION
    setEnabled(MoveAction, moveEnabled);
    setEnabled(MaximizeAction, false);
    setEnabled(MinimizeAction, true);
    setEnabled(RestoreAction, true);
    setEnabled(ResizeAction, resizeEnabled);
#endif // QT_NO_ACTION

    Q_ASSERT(q->windowState() & Qt::WindowMaximized);
    Q_ASSERT(!(q->windowState() & Qt::WindowMinimized));

    restoreFocus();
    updateMask();
}